

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O3

string * bloaty::RangeMap::EntryDebugString
                   (string *__return_storage_ptr__,uint64_t addr,uint64_t size,uint64_t other_start,
                   string *label)

{
  uint64_t uVar1;
  size_type sVar2;
  Hex hex;
  Hex hex_00;
  Hex hex_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  Hex hex_02;
  string end;
  long *local_120;
  char *local_118;
  long local_110 [2];
  long *local_100;
  undefined8 local_f8;
  long local_f0 [2];
  AlphaNum local_e0;
  undefined1 local_b0 [16];
  long local_a0;
  long *plStack_98;
  char local_90 [8];
  char *local_88;
  undefined8 local_80;
  long *local_78;
  undefined8 local_70;
  char *local_68;
  long *local_60;
  char *local_58;
  undefined8 local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  uVar1 = other_start;
  if (size == 0xffffffffffffffff) {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"?","");
  }
  else {
    local_a0 = 0;
    plStack_98 = (long *)0x0;
    local_b0._8_8_ = (char *)0x0;
    hex._8_8_ = other_start;
    hex.value = 0x3001;
    local_b0._0_8_ = &local_a0;
    absl::AbslStringify<absl::strings_internal::StringifySink>
              ((absl *)local_b0,(StringifySink *)(size + addr),hex);
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,local_b0._0_8_,(char *)(local_b0._8_8_ + local_b0._0_8_));
    if ((long *)local_b0._0_8_ != &local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0 + 1);
    }
  }
  local_110[0] = 0;
  local_110[1] = 0;
  local_118 = (char *)0x0;
  hex_00.width = (char)uVar1;
  hex_00.fill = (char)(uVar1 >> 8);
  hex_00._10_6_ = (int6)(uVar1 >> 0x10);
  hex_00.value = 0x3001;
  local_120 = local_110;
  absl::AbslStringify<absl::strings_internal::StringifySink>
            ((absl *)&local_120,(StringifySink *)addr,hex_00);
  local_b0._0_8_ = 1;
  local_b0._8_8_ = "[";
  local_a0 = (long)local_118;
  plStack_98 = local_120;
  local_90[0] = '\x02';
  local_90[1] = '\0';
  local_90[2] = '\0';
  local_90[3] = '\0';
  local_90[4] = '\0';
  local_90[5] = '\0';
  local_90[6] = '\0';
  local_90[7] = '\0';
  local_88 = ", ";
  local_80 = local_f8;
  local_78 = local_100;
  local_70 = 8;
  local_68 = "] (size=";
  local_e0.digits_[0] = '\0';
  local_e0.digits_[1] = '\0';
  local_e0.digits_[2] = '\0';
  local_e0.digits_[3] = '\0';
  local_e0.digits_[4] = '\0';
  local_e0.digits_[5] = '\0';
  local_e0.digits_[6] = '\0';
  local_e0.digits_[7] = '\0';
  local_e0.digits_[8] = '\0';
  local_e0.digits_[9] = '\0';
  local_e0.digits_[10] = '\0';
  local_e0.digits_[0xb] = '\0';
  local_e0.digits_[0xc] = '\0';
  local_e0.digits_[0xd] = '\0';
  local_e0.digits_[0xe] = '\0';
  local_e0.digits_[0xf] = '\0';
  local_e0.piece_._M_str = (char *)0x0;
  hex_01._8_8_ = local_118;
  hex_01.value = 0x3001;
  local_e0.piece_._M_len = (size_t)local_e0.digits_;
  absl::AbslStringify<absl::strings_internal::StringifySink>
            ((absl *)&local_e0,(StringifySink *)size,hex_01);
  local_60 = (long *)local_e0.piece_._M_str;
  local_58 = (char *)local_e0.piece_._M_len;
  local_50 = 3;
  local_48 = "): ";
  local_38 = (label->_M_dataplus)._M_p;
  sVar2 = label->_M_string_length;
  pieces._M_len = sVar2;
  pieces._M_array = (iterator)0x8;
  local_40 = sVar2;
  absl::strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)local_b0,pieces);
  if ((char *)local_e0.piece_._M_len != local_e0.digits_) {
    operator_delete((void *)local_e0.piece_._M_len,local_e0.digits_._0_8_ + 1);
  }
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (other_start != 0xffffffffffffffff) {
    local_b0._0_8_ = 0xe;
    local_b0._8_8_ = ", other_start=";
    local_110[0] = 0;
    local_110[1] = 0;
    local_118 = (char *)0x0;
    hex_02.width = (char)sVar2;
    hex_02.fill = (char)(sVar2 >> 8);
    hex_02._10_6_ = (int6)(sVar2 >> 0x10);
    hex_02.value = 0x3001;
    local_120 = local_110;
    absl::AbslStringify<absl::strings_internal::StringifySink>
              ((absl *)&local_120,(StringifySink *)other_start,hex_02);
    local_e0.piece_._M_len = (size_t)local_118;
    local_e0.piece_._M_str = (char *)local_120;
    absl::StrAppend(__return_storage_ptr__,(AlphaNum *)local_b0,&local_e0);
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0] + 1);
    }
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string EntryDebugString(uint64_t addr, uint64_t size,
                                      uint64_t other_start,
                                      const std::string& label) {
    std::string end =
        size == kUnknownSize ? "?" : absl::StrCat(absl::Hex(addr + size));
    std::string ret = absl::StrCat("[", absl::Hex(addr), ", ", end,
                                   "] (size=", absl::Hex(size), "): ", label);
    if (other_start != UINT64_MAX) {
      absl::StrAppend(&ret, ", other_start=", absl::Hex(other_start));
    }
    return ret;
  }